

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gherkin_line.c
# Opt level: O0

wchar_t * GherkinLine_get_language(GherkinLine_conflict *line)

{
  _Bool _Var1;
  wchar_t *pwVar2;
  bool bVar3;
  byte local_23;
  _Bool local_22;
  wchar_t *local_20;
  wchar_t *end;
  wchar_t *start;
  GherkinLine_conflict *line_local;
  
  end = line->trimmed_line;
  while( true ) {
    bVar3 = false;
    if (*end != L'\0') {
      bVar3 = *end != L':';
    }
    if (!bVar3) break;
    end = end + 1;
  }
  do {
    end = end + 1;
    local_22 = false;
    if (*end != L'\0') {
      local_22 = StringUtilities_is_whitespace(*end);
    }
  } while (local_22 != false);
  local_20 = end;
  while( true ) {
    local_23 = 0;
    if (*local_20 != L'\0') {
      _Var1 = StringUtilities_is_whitespace(*local_20);
      local_23 = _Var1 ^ 0xff;
    }
    if ((local_23 & 1) == 0) break;
    local_20 = local_20 + 1;
  }
  pwVar2 = StringUtilities_copy_string_part(end,(wchar_t)((long)local_20 - (long)end >> 2));
  return pwVar2;
}

Assistant:

const wchar_t* GherkinLine_get_language(const GherkinLine* line) {
    const wchar_t* start = line->trimmed_line;
    while (*start != L'\0' && *start != L':')
        ++start;
    ++start;
    while (*start != L'\0' && StringUtilities_is_whitespace(*start))
        ++start;
    const wchar_t* end = start;
    while (*end != L'\0' && !StringUtilities_is_whitespace(*end))
        ++end;
    return StringUtilities_copy_string_part(start, end - start);
}